

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O3

bool __thiscall
chatra::ArgumentMatcher::matches
          (ArgumentMatcher *this,
          vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *args,
          vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *subArgs)

{
  Class *pCVar1;
  Class *pCVar2;
  bool bVar3;
  StringId SVar4;
  const_iterator cVar5;
  pointer pAVar6;
  const_iterator cVar7;
  pointer pAVar8;
  long lVar9;
  pointer pAVar10;
  pointer pAVar11;
  ArgumentSpec *arg;
  ulong uVar12;
  pointer __k;
  long lVar13;
  ulong uVar14;
  Class *local_40;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *local_38;
  
  __k = (args->super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pAVar10 = (args->super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (((long)pAVar10 - (long)__k != 0x10) || (bVar3 = true, __k->key != AnyArgs)) {
    pAVar6 = (subArgs->
             super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = (subArgs->
             super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)pAVar8 - (long)pAVar6 >> 4 ==
        ((long)(this->subArgs).
               super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(this->subArgs).
               super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
      if (pAVar8 != pAVar6) {
        lVar9 = 8;
        uVar12 = 0;
        lVar13 = 8;
        local_38 = args;
        do {
          pCVar1 = *(Class **)
                    ((long)&((this->subArgs).
                             super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                             ._M_impl.super__Vector_impl_data._M_start)->type + lVar13);
          if (((pCVar1 != (Class *)0x0) &&
              (pCVar2 = *(Class **)((long)&pAVar6->key + lVar9), pCVar2 != (Class *)0x0)) &&
             (pCVar2 != pCVar1)) {
            local_40 = pCVar1;
            cVar5 = std::
                    _Hashtable<const_chatra::Class_*,_const_chatra::Class_*,_std::allocator<const_chatra::Class_*>,_std::__detail::_Identity,_std::equal_to<const_chatra::Class_*>,_std::hash<const_chatra::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&(pCVar2->parentsSet)._M_h,&local_40);
            if (cVar5.super__Node_iterator_base<const_chatra::Class_*,_false>._M_cur ==
                (__node_type *)0x0) goto LAB_001ace0d;
            pAVar6 = (subArgs->
                     super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pAVar8 = (subArgs->
                     super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0x18;
          lVar9 = lVar9 + 0x10;
        } while (uVar12 < (ulong)((long)pAVar8 - (long)pAVar6 >> 4));
        __k = (local_38->
              super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
              _M_impl.super__Vector_impl_data._M_start;
        pAVar10 = (local_38->
                  super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      if (__k == pAVar10) {
        local_38 = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)0x0;
        uVar12 = 0;
      }
      else {
        local_38 = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)0x0;
        uVar14 = 0;
        do {
          uVar12 = this->listCount;
          SVar4 = __k->key;
          if (uVar14 < uVar12) {
            pAVar11 = (this->args).
                      super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((SVar4 != Invalid) && (SVar4 != pAVar11[uVar14].name)) goto LAB_001acd81;
            uVar12 = uVar14 + 1;
            pAVar11 = pAVar11 + uVar14;
            pCVar1 = pAVar11->cl;
            if (((pCVar1 != (Class *)0x0) &&
                ((pCVar2 = __k->cl, pCVar2 != (Class *)0x0 && (pCVar2 != pCVar1)))) &&
               (local_40 = pCVar1,
               cVar5 = std::
                       _Hashtable<const_chatra::Class_*,_const_chatra::Class_*,_std::allocator<const_chatra::Class_*>,_std::__detail::_Identity,_std::equal_to<const_chatra::Class_*>,_std::hash<const_chatra::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&(pCVar2->parentsSet)._M_h,&local_40),
               cVar5.super__Node_iterator_base<const_chatra::Class_*,_false>._M_cur ==
               (__node_type *)0x0)) {
              SVar4 = __k->key;
              uVar14 = this->listCount;
              goto LAB_001acd79;
            }
LAB_001acdea:
            local_38 = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)
                       ((long)local_38 + (ulong)(pAVar11->defaultOp == (Node *)0x0));
          }
          else {
LAB_001acd79:
            uVar12 = uVar14;
            if (SVar4 != Invalid) {
LAB_001acd81:
              cVar7 = std::
                      _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&(this->byName)._M_h,&__k->key);
              if (cVar7.
                  super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                  ._M_cur != (__node_type *)0x0) {
                pAVar11 = (this->args).
                          super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          *(long *)((long)cVar7.
                                          super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                                          ._M_cur + 0x10);
                pCVar1 = pAVar11->cl;
                if ((((pCVar1 == (Class *)0x0) || (pCVar2 = __k->cl, pCVar2 == (Class *)0x0)) ||
                    (pCVar2 == pCVar1)) ||
                   (local_40 = pCVar1,
                   cVar5 = std::
                           _Hashtable<const_chatra::Class_*,_const_chatra::Class_*,_std::allocator<const_chatra::Class_*>,_std::__detail::_Identity,_std::equal_to<const_chatra::Class_*>,_std::hash<const_chatra::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(&(pCVar2->parentsSet)._M_h,&local_40),
                   cVar5.super__Node_iterator_base<const_chatra::Class_*,_false>._M_cur !=
                   (__node_type *)0x0)) goto LAB_001acdea;
                goto LAB_001ace0d;
              }
            }
            if ((this->hasListVarArg == false) &&
               ((__k->key == Invalid || (this->hasDictVarArg == false)))) goto LAB_001ace0d;
          }
          __k = __k + 1;
          uVar14 = uVar12;
        } while (__k != pAVar10);
      }
      bVar3 = local_38 ==
              (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)
              (this->listCountWithoutDefaults + this->dictCountWithoutDefaults) &&
              this->listCountWithoutDefaults <= uVar12;
    }
    else {
LAB_001ace0d:
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool ArgumentMatcher::matches(const std::vector<ArgumentSpec>& args, const std::vector<ArgumentSpec>& subArgs) const {

	if (args.size() == 1 && args[0].key == StringId::AnyArgs)
		return true;

	if (subArgs.size() != this->subArgs.size())
		return false;
	for (size_t i = 0; i < subArgs.size(); i++) {
		auto& arg0 = this->subArgs[i];
		auto& arg1 = subArgs[i];
		if (arg0.cl != nullptr && arg1.cl != nullptr && !arg0.cl->isAssignableFrom(arg1.cl))
			return false;
	}

	size_t index = 0;
	size_t matchedCountWithoutDefaults = 0;

	for (auto& arg : args) {
		if (index < listCount) {
			auto& target = this->args[index++];
			if ((arg.key == StringId::Invalid || arg.key == target.name) &&
					(target.cl == nullptr || arg.cl == nullptr || target.cl->isAssignableFrom(arg.cl))) {
				if (target.defaultOp == nullptr)
					matchedCountWithoutDefaults++;
				continue;
			}
			index = listCount;
		}
		if (arg.key != StringId::Invalid) {
			auto it = byName.find(arg.key);
			if (it != byName.end()) {
				auto& target = this->args[it->second];
				if (target.cl != nullptr && arg.cl != nullptr && !target.cl->isAssignableFrom(arg.cl))
					return false;
				if (target.defaultOp == nullptr)
					matchedCountWithoutDefaults++;
				continue;
			}
		}
		if (hasListVarArg || (arg.key != StringId::Invalid && hasDictVarArg))
			continue;
		return false;
	}

	return index >= listCountWithoutDefaults &&
			matchedCountWithoutDefaults == listCountWithoutDefaults + dictCountWithoutDefaults;
}